

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O0

CubeFace deqp::gles31::Functional::getCubeFaceFromNdx(int ndx)

{
  CubeFace local_c;
  int ndx_local;
  
  switch(ndx) {
  case 0:
    local_c = CUBEFACE_POSITIVE_X;
    break;
  case 1:
    local_c = CUBEFACE_NEGATIVE_X;
    break;
  case 2:
    local_c = CUBEFACE_POSITIVE_Y;
    break;
  case 3:
    local_c = CUBEFACE_NEGATIVE_Y;
    break;
  case 4:
    local_c = CUBEFACE_POSITIVE_Z;
    break;
  case 5:
    local_c = CUBEFACE_NEGATIVE_Z;
    break;
  default:
    local_c = CUBEFACE_LAST;
  }
  return local_c;
}

Assistant:

static tcu::CubeFace getCubeFaceFromNdx (int ndx)
{
	switch (ndx)
	{
		case 0:	return tcu::CUBEFACE_POSITIVE_X;
		case 1:	return tcu::CUBEFACE_NEGATIVE_X;
		case 2:	return tcu::CUBEFACE_POSITIVE_Y;
		case 3:	return tcu::CUBEFACE_NEGATIVE_Y;
		case 4:	return tcu::CUBEFACE_POSITIVE_Z;
		case 5:	return tcu::CUBEFACE_NEGATIVE_Z;
		default:
			DE_ASSERT(false);
			return tcu::CUBEFACE_LAST;
	}
}